

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateLdHomeObj(Lowerer *this,Instr *instr)

{
  Func *func;
  Opnd *pOVar1;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  AddrOpnd *pAVar7;
  Lowerer *baseOpnd;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  IndirOpnd *pIVar9;
  BranchInstr *pBVar10;
  JITTimeFunctionBody *pJVar11;
  RegOpnd *dst;
  Lowerer *pLVar12;
  int32 offset;
  LabelInstr *instr_00;
  Opnd *local_60;
  Opnd *functionObjOpnd;
  Lowerer *local_50;
  Opnd *local_48;
  LabelInstr *local_40;
  LabelInstr *local_38;
  
  func = instr->m_func;
  local_50 = this;
  functionObjOpnd = (Opnd *)IR::LabelInstr::New(Label,func,false);
  local_40 = IR::LabelInstr::New(Label,func,false);
  local_38 = IR::LabelInstr::New(Label,func,false);
  local_38->m_name = L"ScriptFunctionWithHomeObj";
  iVar6 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
  pAVar7 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar6),AddrOpndKindDynamicVar,instr->m_func,true,
                             (Var)0x0);
  baseOpnd = (Lowerer *)IR::RegOpnd::New(TyUint64,func);
  pOVar1 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  local_48 = pOVar1;
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x642c,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  InsertMove(local_48,&pAVar7->super_Opnd,instr,true);
  pLVar12 = local_50;
  local_60 = (Opnd *)0x0;
  LowererMD::LoadFunctionObjectOpnd(&local_50->m_lowererMD,instr,&local_60);
  InsertMove((Opnd *)baseOpnd,local_60,instr,true);
  pSVar2 = instr->m_func->m_scriptContextInfo;
  iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x2e);
  pAVar7 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_00,iVar6),AddrOpndKindDynamicVtable,
                             pLVar12->m_func,false,(Var)0x0);
  pLVar12 = baseOpnd;
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0,TyUint64,func,false);
  pOVar1 = functionObjOpnd;
  pBVar10 = InsertCompareBranch(pLVar12,&pIVar9->super_Opnd,&pAVar7->super_Opnd,BrEq_A,true,
                                (LabelInstr *)functionObjOpnd,instr,false);
  LowererMD::InsertObjectPoison((Opnd *)baseOpnd,pBVar10,instr,false);
  pJVar11 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  bVar5 = JITTimeFunctionBody::HasHomeObj(pJVar11);
  if (bVar5) {
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    bVar5 = JITTimeFunctionBody::IsCoroutine(pJVar11);
    offset = 0x50;
    if (!bVar5) {
      dst = IR::RegOpnd::New(TyUint8,instr->m_func);
      pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x40,TyUint8,instr->m_func,false);
      InsertMove(&dst->super_Opnd,&pIVar9->super_Opnd,instr,true);
      InsertTest(&dst->super_Opnd,&dst->super_Opnd,instr);
      pBVar10 = InsertBranch(BrEq_A,false,local_38,instr);
      LowererMD::InsertObjectPoison((Opnd *)baseOpnd,pBVar10,instr,false);
      offset = 0x70;
    }
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    JITTimeFunctionBody::HasComputedName(pJVar11);
    pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,offset,TyUint64,func,false);
    InsertMove((Opnd *)baseOpnd,&pIVar9->super_Opnd,instr,true);
    instr_00 = local_40;
    InsertBranch(Br,false,local_40,instr);
    IR::Instr::InsertBefore(instr,&local_38->super_Instr);
    pIVar9 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x48,TyUint64,func,false);
    InsertMove((Opnd *)baseOpnd,&pIVar9->super_Opnd,instr,true);
  }
  else {
    InsertBranch(Br,false,(LabelInstr *)pOVar1,instr);
    instr_00 = local_40;
  }
  IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
  InsertTest((Opnd *)baseOpnd,(Opnd *)baseOpnd,instr);
  InsertBranch(BrEq_A,false,(LabelInstr *)pOVar1,instr);
  InsertMove(local_48,(Opnd *)baseOpnd,instr,true);
  IR::Instr::InsertBefore(instr,(Instr *)pOVar1);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateLdHomeObj(IR::Instr* instr)
{
    //  MOV dst, undefined
    //  MOV instance, functionObject  // functionObject through stack params or src1
    //  CMP [instance], VtableStackScriptFunction
    //  JE  $Done
    //  MOV instance, instance->homeObj
    //  TEST instance, instance
    //  JZ  $Done
    //  MOV dst, instance
    //  $Done:

    Func *func = instr->m_func;

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *testLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *scriptFuncLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    LABELNAMESET(scriptFuncLabel, "ScriptFunctionWithHomeObj");
    IR::Opnd *opndUndefAddress = this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined);

    IR::RegOpnd *instanceRegOpnd = IR::RegOpnd::New(TyMachPtr, func);

    IR::Opnd *dstOpnd = instr->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    Lowerer::InsertMove(dstOpnd, opndUndefAddress, instr);

    IR::Opnd * functionObjOpnd = nullptr;
    m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Lowerer::InsertMove(instanceRegOpnd, functionObjOpnd, instr);

    IR::Opnd * vtableAddressOpnd = this->LoadVTableValueOpnd(instr, VTableValue::VtableStackScriptFunction);
    IR::BranchInstr* branchInstr = InsertCompareBranch(IR::IndirOpnd::New(instanceRegOpnd, 0, TyMachPtr, func), vtableAddressOpnd,
        Js::OpCode::BrEq_A, true, labelDone, instr);

    InsertObjectPoison(instanceRegOpnd, branchInstr, instr, false);

    if (func->GetJITFunctionBody()->HasHomeObj())
    {
        // Is this a generator function with home obj?
        if (func->GetJITFunctionBody()->IsCoroutine())
        {
            uint32 homeObjectOffset = Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::GetOffsetOfHomeObj();

            // Is this a generator function with home obj and computed name?
            if (func->GetJITFunctionBody()->HasComputedName())
            {
                homeObjectOffset = Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>::GetOffsetOfHomeObj();
            }

            {
                IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, homeObjectOffset, TyMachPtr, func);
                Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instr);
            }

            InsertBranch(Js::OpCode::Br, testLabel, instr);
        }
        else
        {
            IR::RegOpnd* funcObjHasInlineCachesOpnd = IR::RegOpnd::New(TyUint8, instr->m_func);
            this->InsertMove(funcObjHasInlineCachesOpnd, IR::IndirOpnd::New(instanceRegOpnd, Js::ScriptFunction::GetOffsetOfHasInlineCaches(), TyUint8, instr->m_func), instr);

            IR::BranchInstr* inlineFuncHomObjCompNameBr = InsertTestBranch(funcObjHasInlineCachesOpnd, funcObjHasInlineCachesOpnd, Js::OpCode::BrEq_A, scriptFuncLabel, instr);
            InsertObjectPoison(instanceRegOpnd, inlineFuncHomObjCompNameBr, instr, false);

            if (func->GetJITFunctionBody()->HasComputedName())
            {
                // Is this a function with inline cache, home obj and computed name?
                {
                    IR::IndirOpnd* indirInlineFuncHomeObjCompNameOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>::GetOffsetOfHomeObj(), TyMachPtr, func);
                    Lowerer::InsertMove(instanceRegOpnd, indirInlineFuncHomeObjCompNameOpnd, instr);
                    InsertBranch(Js::OpCode::Br, testLabel, instr);
                }
            }
            else
            {
                // Is this a function with inline cache and home obj?
                {
                    IR::IndirOpnd* indirInlineFuncHomeObjOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::GetOffsetOfHomeObj(), TyMachPtr, func);
                    Lowerer::InsertMove(instanceRegOpnd, indirInlineFuncHomeObjOpnd, instr);
                    InsertBranch(Js::OpCode::Br, testLabel, instr);
                }
            }
        }

        instr->InsertBefore(scriptFuncLabel);

        // All other cases
        {
            IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::ScriptFunctionWithHomeObj::GetOffsetOfHomeObj(), TyMachPtr, func);
            Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instr);
        }
    }
    else
    {
        // Even if the function does not have home object in eval cases we still have the LdHomeObj opcode
        InsertBranch(Js::OpCode::Br, labelDone, instr);
    }

    instr->InsertBefore(testLabel);
    InsertTestBranch(instanceRegOpnd, instanceRegOpnd, Js::OpCode::BrEq_A, labelDone, instr);

    Lowerer::InsertMove(dstOpnd, instanceRegOpnd, instr);

    instr->InsertBefore(labelDone);
    instr->Remove();
}